

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void fscope_end(FuncState *fs)

{
  byte bVar1;
  BCPos BVar2;
  LexState *ls;
  FuncScope *bl;
  FuncState *pFVar3;
  VarInfo *pVVar4;
  long lVar5;
  MSize idx;
  ulong uVar6;
  
  ls = fs->ls;
  bl = fs->bl;
  fs->bl = bl->prev;
  bVar1 = bl->nactvar;
  pFVar3 = ls->fs;
  uVar6 = (ulong)pFVar3->nactvar;
  if ((uint)bVar1 < pFVar3->nactvar) {
    BVar2 = pFVar3->pc;
    pVVar4 = ls->vstack;
    do {
      lVar5 = uVar6 - 1;
      uVar6 = uVar6 - 1;
      pVVar4[pFVar3->varmap[lVar5]].endpc = BVar2;
    } while (bVar1 < uVar6);
    pFVar3->nactvar = (BCReg)uVar6;
  }
  fs->freereg = fs->nactvar;
  if ((bl->flags & 0x18) == 8) {
    bcemit_INS(fs,(uint)bVar1 << 8 | 0x80000032);
  }
  if ((bl->flags & 2) != 0) {
    if ((bl->flags & 1) == 0) goto LAB_00128fbc;
    idx = gola_new(ls,(GCstr *)0x1,'\x04',fs->pc);
    ls->vtop = idx;
    gola_resolve(ls,bl,idx);
  }
  if ((bl->flags & 4) == 0) {
    return;
  }
LAB_00128fbc:
  gola_fixup(ls,bl);
  return;
}

Assistant:

static void fscope_end(FuncState *fs)
{
  FuncScope *bl = fs->bl;
  LexState *ls = fs->ls;
  fs->bl = bl->prev;
  var_remove(ls, bl->nactvar);
  fs->freereg = fs->nactvar;
  lj_assertFS(bl->nactvar == fs->nactvar, "bad regalloc");
  if ((bl->flags & (FSCOPE_UPVAL|FSCOPE_NOCLOSE)) == FSCOPE_UPVAL)
    bcemit_AJ(fs, BC_UCLO, bl->nactvar, 0);
  if ((bl->flags & FSCOPE_BREAK)) {
    if ((bl->flags & FSCOPE_LOOP)) {
      MSize idx = gola_new(ls, NAME_BREAK, VSTACK_LABEL, fs->pc);
      ls->vtop = idx;  /* Drop break label immediately. */
      gola_resolve(ls, bl, idx);
    } else {  /* Need the fixup step to propagate the breaks. */
      gola_fixup(ls, bl);
      return;
    }
  }
  if ((bl->flags & FSCOPE_GOLA)) {
    gola_fixup(ls, bl);
  }
}